

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O1

void composition_solid_source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  bool bVar1;
  uint32_t *puVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (const_alpha != 0xff) {
    if (0 < length) {
      uVar7 = (color >> 8 & 0xff00ff) * const_alpha;
      uVar4 = (color & 0xff00ff) * const_alpha;
      uVar6 = 0;
      do {
        uVar9 = (dest[uVar6] & 0xff00ff) * (0xff - const_alpha);
        uVar8 = (dest[uVar6] >> 8 & 0xff00ff) * (0xff - const_alpha);
        dest[uVar6] = (uVar8 + 0x800080 + (uVar8 >> 8 & 0xff00ff) & 0xff00ff00) +
                      (uVar9 + 0x800080 + (uVar9 >> 8 & 0xff00ff) >> 8 & 0xff00ff) +
                      (uVar4 + 0x800080 + (uVar4 >> 8 & 0xff00ff) >> 8 & 0xff00ff |
                      uVar7 + 0x800080 + (uVar7 >> 8 & 0xff00ff) & 0xff00ff00);
        uVar6 = uVar6 + 1;
      } while ((uint)length != uVar6);
    }
    return;
  }
  if (((ulong)dest & 0xf) != 0 && length != 0) {
    puVar2 = dest + 1;
    iVar5 = length;
    do {
      *dest = color;
      dest = dest + 1;
      length = iVar5 + -1;
      if (iVar5 == 1) break;
      uVar6 = (ulong)puVar2 & 0xf;
      puVar2 = puVar2 + 1;
      iVar5 = length;
    } while (uVar6 != 0);
  }
  iVar5 = length;
  if (0x1f < length) {
    do {
      *dest = color;
      dest[1] = color;
      dest[2] = color;
      dest[3] = color;
      dest[4] = color;
      dest[5] = color;
      dest[6] = color;
      dest[7] = color;
      dest[8] = color;
      dest[9] = color;
      dest[10] = color;
      dest[0xb] = color;
      dest[0xc] = color;
      dest[0xd] = color;
      dest[0xe] = color;
      dest[0xf] = color;
      dest[0x10] = color;
      dest[0x11] = color;
      dest[0x12] = color;
      dest[0x13] = color;
      dest[0x14] = color;
      dest[0x15] = color;
      dest[0x16] = color;
      dest[0x17] = color;
      dest[0x18] = color;
      dest[0x19] = color;
      dest[0x1a] = color;
      dest[0x1b] = color;
      dest[0x1c] = color;
      dest[0x1d] = color;
      dest[0x1e] = color;
      dest[0x1f] = color;
      dest = dest + 0x20;
      length = iVar5 + -0x20;
      bVar1 = 0x3f < iVar5;
      iVar5 = length;
    } while (bVar1);
  }
  if (0xf < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest[4] = color;
    dest[5] = color;
    dest[6] = color;
    dest[7] = color;
    dest[8] = color;
    dest[9] = color;
    dest[10] = color;
    dest[0xb] = color;
    dest[0xc] = color;
    dest[0xd] = color;
    dest[0xe] = color;
    dest[0xf] = color;
    dest = dest + 0x10;
    length = length + -0x10;
  }
  if (7 < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest[4] = color;
    dest[5] = color;
    dest[6] = color;
    dest[7] = color;
    dest = dest + 8;
    length = length + -8;
  }
  if (3 < length) {
    *dest = color;
    dest[1] = color;
    dest[2] = color;
    dest[3] = color;
    dest = dest + 4;
    length = length + -4;
  }
  if (length != 0) {
    lVar3 = 0;
    do {
      dest[lVar3] = color;
      lVar3 = lVar3 + 1;
    } while (length != (int)lVar3);
  }
  return;
}

Assistant:

static void composition_solid_source(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, color);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        color = BYTE_MUL(color, const_alpha);
        for(int i = 0; i < length; i++) {
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
        }
    }
}